

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmpar.c
# Opt level: O2

int lmpar_cvkit(integer *n,doublereal *r__,integer *ldr,integer *ipvt,doublereal *diag,
               doublereal *qtb,doublereal *delta,doublereal *par,doublereal *x,doublereal *sdiag,
               doublereal *wa1,doublereal *wa2)

{
  ulong uVar1;
  long lVar2;
  doublereal *pdVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  doublereal dVar12;
  doublereal dVar13;
  double dVar14;
  doublereal dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  long local_b8;
  double local_88;
  
  uVar1 = *ldr;
  dVar12 = dpmpar_cvkit(&c__2);
  lVar8 = *n;
  lVar2 = 0;
  lVar4 = 0;
  if (0 < lVar8) {
    lVar4 = lVar8;
  }
  lVar7 = 1;
  pdVar3 = r__;
  lVar11 = lVar8;
  for (; lVar4 != lVar2; lVar2 = lVar2 + 1) {
    wa1[lVar2] = qtb[lVar2];
    lVar10 = lVar7 + -1;
    if (*pdVar3 != 0.0) {
      lVar10 = lVar11;
    }
    if (NAN(*pdVar3)) {
      lVar10 = lVar11;
    }
    if (lVar11 == lVar8) {
      lVar11 = lVar10;
    }
    if (lVar11 < lVar8) {
      wa1[lVar2] = 0.0;
    }
    lVar7 = lVar7 + 1;
    pdVar3 = pdVar3 + uVar1 + 1;
  }
  if (0 < lVar11) {
    pdVar3 = (doublereal *)((lVar11 * 8 + -8) * uVar1 + (long)r__);
    lVar8 = lVar11;
    for (lVar2 = 1; lVar2 != lVar11 + 1; lVar2 = lVar2 + 1) {
      lVar10 = lVar11 - lVar2;
      dVar16 = wa1[lVar10];
      dVar14 = r__[~uVar1 + lVar10 + (lVar10 + 1) * uVar1 + 1];
      wa1[lVar10] = dVar16 / dVar14;
      lVar7 = 1;
      if (0 < lVar10) {
        for (; lVar8 != lVar7; lVar7 = lVar7 + 1) {
          wa1[lVar7 + -1] = wa1[lVar7 + -1] - pdVar3[lVar7 + -1] * (dVar16 / dVar14);
        }
      }
      lVar8 = lVar8 + -1;
      pdVar3 = pdVar3 + -uVar1;
    }
  }
  for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
    x[ipvt[lVar8] + -1] = wa1[lVar8];
  }
  for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
    wa2[lVar8] = diag[lVar8] * x[lVar8];
  }
  dVar13 = enorm_cvkit(n,wa2);
  dVar16 = dVar13 - *delta;
  if (dVar16 <= *delta * 0.1) {
    *par = 0.0;
  }
  else {
    lVar8 = *n;
    local_88 = 0.0;
    if (lVar8 <= lVar11) {
      lVar4 = 0;
      if (lVar8 < 1) {
        lVar8 = lVar4;
      }
      for (; lVar8 != lVar4; lVar4 = lVar4 + 1) {
        wa1[lVar4] = (wa2[ipvt[lVar4] + -1] / dVar13) * diag[ipvt[lVar4] + -1];
      }
      lVar4 = 0;
      pdVar3 = r__;
      for (uVar5 = 1; uVar5 != lVar8 + 1U; uVar5 = uVar5 + 1) {
        dVar14 = 0.0;
        if (1 < uVar5) {
          dVar14 = 0.0;
          for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
            dVar14 = dVar14 + pdVar3[lVar2] * wa1[lVar2];
          }
        }
        wa1[uVar5 - 1] = (wa1[uVar5 - 1] - dVar14) / r__[~uVar1 + uVar5 * (uVar1 + 1)];
        lVar4 = lVar4 + 1;
        pdVar3 = pdVar3 + uVar1;
      }
      dVar15 = enorm_cvkit(n,wa1);
      local_88 = ((dVar16 / *delta) / dVar15) / dVar15;
      lVar8 = *n;
    }
    if (lVar8 < 1) {
      lVar8 = 0;
    }
    lVar4 = 1;
    pdVar3 = r__;
    for (lVar2 = 2; lVar2 != lVar8 + 2; lVar2 = lVar2 + 1) {
      dVar14 = 0.0;
      for (lVar7 = 0; lVar4 != lVar7; lVar7 = lVar7 + 1) {
        dVar14 = dVar14 + pdVar3[lVar7] * qtb[lVar7];
      }
      wa1[lVar4 + -1] = dVar14 / diag[ipvt[lVar4 + -1] + -1];
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + uVar1;
    }
    dVar15 = enorm_cvkit(n,wa1);
    dVar14 = *delta;
    dVar18 = dVar15 / dVar14;
    if ((dVar18 == 0.0) && (!NAN(dVar18))) {
      if (0.1 <= dVar14) {
        dVar14 = 0.1;
      }
      dVar18 = dVar12 / dVar14;
    }
    uVar5 = -(ulong)(local_88 <= *par);
    dVar14 = (double)(~uVar5 & (ulong)local_88 | (ulong)*par & uVar5);
    uVar5 = -(ulong)(dVar14 <= dVar18);
    dVar14 = (double)(~uVar5 & (ulong)dVar18 | uVar5 & (ulong)dVar14);
    uVar5 = -(ulong)(dVar14 == 0.0);
    dVar14 = (double)(uVar5 & (ulong)(dVar15 / dVar13) | ~uVar5 & (ulong)dVar14);
    local_b8 = 0;
    while( true ) {
      if ((dVar14 == 0.0) && (!NAN(dVar14))) {
        uVar5 = -(ulong)(dVar18 * 0.001 <= dVar12);
        dVar14 = (double)(~uVar5 & (ulong)(dVar18 * 0.001) | uVar5 & (ulong)dVar12);
      }
      *par = dVar14;
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      local_b8 = local_b8 + 1;
      lVar8 = *n;
      if (*n < 1) {
        lVar8 = 0;
      }
      for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
        wa1[lVar4] = diag[lVar4] * dVar14;
      }
      qrsolv_cvkit(n,r__,ldr,ipvt,wa1,qtb,x,sdiag,wa2);
      lVar8 = *n;
      if (*n < 1) {
        lVar8 = 0;
      }
      for (lVar4 = 0; lVar8 != lVar4; lVar4 = lVar4 + 1) {
        wa2[lVar4] = diag[lVar4] * x[lVar4];
      }
      dVar13 = enorm_cvkit(n,wa2);
      dVar17 = dVar13 - *delta;
      uVar5 = -(ulong)(-dVar17 <= dVar17);
      if ((((double)(~uVar5 & (ulong)-dVar17 | uVar5 & (ulong)dVar17) <= *delta * 0.1) ||
          ((((local_88 == 0.0 && (!NAN(local_88))) && (dVar17 <= dVar16)) && (dVar16 < 0.0)))) ||
         (local_b8 == 10)) break;
      lVar8 = *n;
      lVar4 = 0;
      if (0 < lVar8) {
        lVar4 = lVar8;
      }
      for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
        wa1[lVar2] = (wa2[ipvt[lVar2] + -1] / dVar13) * diag[ipvt[lVar2] + -1];
      }
      pdVar6 = r__ + 1;
      lVar2 = 1;
      while (lVar2 != lVar4 + 1) {
        dVar16 = wa1[lVar2 + -1];
        dVar14 = sdiag[lVar2 + -1];
        wa1[lVar2 + -1] = dVar16 / dVar14;
        lVar7 = lVar2 + 1;
        pdVar9 = pdVar6;
        if (lVar2 < lVar8) {
          for (; lVar7 <= lVar8; lVar7 = lVar7 + 1) {
            wa1[lVar7 + -1] = wa1[lVar7 + -1] - *pdVar9 * (dVar16 / dVar14);
            pdVar9 = pdVar9 + 1;
          }
        }
        pdVar6 = pdVar6 + uVar1 + 1;
        lVar2 = lVar2 + 1;
      }
      dVar13 = enorm_cvkit(n,wa1);
      dVar16 = *par;
      local_88 = (double)(~-(ulong)(0.0 < dVar17) & (ulong)local_88 |
                         (~-(ulong)(dVar16 <= local_88) & (ulong)dVar16 |
                         -(ulong)(dVar16 <= local_88) & (ulong)local_88) & -(ulong)(0.0 < dVar17));
      dVar18 = (double)(~-(ulong)(dVar17 < 0.0) & (ulong)dVar18 |
                       (~-(ulong)(dVar18 <= dVar16) & (ulong)dVar16 |
                       -(ulong)(dVar18 <= dVar16) & (ulong)dVar18) & -(ulong)(dVar17 < 0.0));
      dVar16 = ((dVar17 / *delta) / dVar13) / dVar13 + dVar16;
      uVar5 = -(ulong)(dVar16 <= local_88);
      dVar14 = (double)(~uVar5 & (ulong)dVar16 | uVar5 & (ulong)local_88);
      dVar16 = dVar17;
    }
  }
  return 0;
}

Assistant:

int lmpar_cvkit(integer *n, doublereal *r__, integer *ldr,
	integer *ipvt, doublereal *diag, doublereal *qtb, doublereal *delta,
	doublereal *par, doublereal *x, doublereal *sdiag, doublereal *wa1,
	doublereal *wa2)
{
    /* Initialized data */

    static doublereal p1 = .1;
    static doublereal p001 = .001;
    static doublereal zero = 0.;

    /* System generated locals */
    integer r_dim1, r_offset, i__1, i__2;
    doublereal d__1, d__2;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    doublereal parc, parl;
    integer iter;
    doublereal temp, paru;
    integer i__, j, k, l;
    doublereal dwarf;
    integer nsing;
    extern doublereal enorm_cvkit(integer *, doublereal *);
    doublereal gnorm, fp;
    extern doublereal dpmpar_cvkit(integer *);
    doublereal dxnorm;
    integer jm1, jp1;
    extern /* Subroutine */ int qrsolv_cvkit(integer *, doublereal *, integer *,
	    integer *, doublereal *, doublereal *, doublereal *, doublereal *,
	     doublereal *);
    doublereal sum;

/*<       integer n,ldr >*/
/*<       integer ipvt(n) >*/
/*<       double precision delta,par >*/
/*<    >*/
/*     ********** */

/*     subroutine lmpar */

/*     given an m by n matrix a, an n by n nonsingular diagonal */
/*     matrix d, an m-vector b, and a positive number delta, */
/*     the problem is to determine a value for the parameter */
/*     par such that if x solves the system */

/*           a*x = b ,     sqrt(par)*d*x = 0 , */

/*     in the least squares sense, and dxnorm is the euclidean */
/*     norm of d*x, then either par is zero and */

/*           (dxnorm-delta) .le. 0.1*delta , */

/*     or par is positive and */

/*           abs(dxnorm-delta) .le. 0.1*delta . */

/*     this subroutine completes the solution of the problem */
/*     if it is provided with the necessary information from the */
/*     qr factorization, with column pivoting, of a. that is, if */
/*     a*p = q*r, where p is a permutation matrix, q has orthogonal */
/*     columns, and r is an upper triangular matrix with diagonal */
/*     elements of nonincreasing magnitude, then lmpar expects */
/*     the full upper triangle of r, the permutation matrix p, */
/*     and the first n components of (q transpose)*b. on output */
/*     lmpar also provides an upper triangular matrix s such that */

/*            t   t                   t */
/*           p *(a *a + par*d*d)*p = s *s . */

/*     s is employed within lmpar and may be of separate interest. */

/*     only a few iterations are generally needed for convergence */
/*     of the algorithm. if, however, the limit of 10 iterations */
/*     is reached, then the output par will contain the best */
/*     value obtained so far. */

/*     the subroutine statement is */

/*       subroutine lmpar(n,r,ldr,ipvt,diag,qtb,delta,par,x,sdiag, */
/*                        wa1,wa2) */

/*     where */

/*       n is a positive integer input variable set to the order of r. */

/*       r is an n by n array. on input the full upper triangle */
/*         must contain the full upper triangle of the matrix r. */
/*         on output the full upper triangle is unaltered, and the */
/*         strict lower triangle contains the strict upper triangle */
/*         (transposed) of the upper triangular matrix s. */

/*       ldr is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array r. */

/*       ipvt is an integer input array of length n which defines the */
/*         permutation matrix p such that a*p = q*r. column j of p */
/*         is column ipvt(j) of the identity matrix. */

/*       diag is an input array of length n which must contain the */
/*         diagonal elements of the matrix d. */

/*       qtb is an input array of length n which must contain the first */
/*         n elements of the vector (q transpose)*b. */

/*       delta is a positive input variable which specifies an upper */
/*         bound on the euclidean norm of d*x. */

/*       par is a nonnegative variable. on input par contains an */
/*         initial estimate of the levenberg-marquardt parameter. */
/*         on output par contains the final estimate. */

/*       x is an output array of length n which contains the least */
/*         squares solution of the system a*x = b, sqrt(par)*d*x = 0, */
/*         for the output par. */

/*       sdiag is an output array of length n which contains the */
/*         diagonal elements of the upper triangular matrix s. */

/*       wa1 and wa2 are work arrays of length n. */

/*     subprograms called */

/*       minpack-supplied ... dpmpar,enorm,qrsolv */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
/*<       integer i,iter,j,jm1,jp1,k,l,nsing >*/
/*<    >*/
/*<       double precision dpmpar,enorm >*/
/*<       data p1,p001,zero /1.0d-1,1.0d-3,0.0d0/ >*/
    /* Parameter adjustments */
    --wa2;
    --wa1;
    --sdiag;
    --x;
    --qtb;
    --diag;
    --ipvt;
    r_dim1 = *ldr;
    r_offset = 1 + r_dim1 * 1;
    r__ -= r_offset;

    /* Function Body */

/*     dwarf is the smallest positive magnitude. */

/*<       dwarf = dpmpar(2) >*/
    dwarf = dpmpar_cvkit(&c__2);

/*     compute and store in x the gauss-newton direction. if the */
/*     jacobian is rank-deficient, obtain a least squares solution. */

/*<       nsing = n >*/
    nsing = *n;
/*<       do 10 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          wa1(j) = qtb(j) >*/
	wa1[j] = qtb[j];
/*<          if (r(j,j) .eq. zero .and. nsing .eq. n) nsing = j - 1 >*/
	if (r__[j + j * r_dim1] == zero && nsing == *n) {
	    nsing = j - 1;
	}
/*<          if (nsing .lt. n) wa1(j) = zero >*/
	if (nsing < *n) {
	    wa1[j] = zero;
	}
/*<    10    continue >*/
/* L10: */
    }
/*<       if (nsing .lt. 1) go to 50 >*/
    if (nsing < 1) {
	goto L50;
    }
/*<       do 40 k = 1, nsing >*/
    i__1 = nsing;
    for (k = 1; k <= i__1; ++k) {
/*<          j = nsing - k + 1 >*/
	j = nsing - k + 1;
/*<          wa1(j) = wa1(j)/r(j,j) >*/
	wa1[j] /= r__[j + j * r_dim1];
/*<          temp = wa1(j) >*/
	temp = wa1[j];
/*<          jm1 = j - 1 >*/
	jm1 = j - 1;
/*<          if (jm1 .lt. 1) go to 30 >*/
	if (jm1 < 1) {
	    goto L30;
	}
/*<          do 20 i = 1, jm1 >*/
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             wa1(i) = wa1(i) - r(i,j)*temp >*/
	    wa1[i__] -= r__[i__ + j * r_dim1] * temp;
/*<    20       continue >*/
/* L20: */
	}
/*<    30    continue >*/
L30:
/*<    40    continue >*/
/* L40: */
	;
    }
/*<    50 continue >*/
L50:
/*<       do 60 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          x(l) = wa1(j) >*/
	x[l] = wa1[j];
/*<    60    continue >*/
/* L60: */
    }

/*     initialize the iteration counter. */
/*     evaluate the function at the origin, and test */
/*     for acceptance of the gauss-newton direction. */

/*<       iter = 0 >*/
    iter = 0;
/*<       do 70 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          wa2(j) = diag(j)*x(j) >*/
	wa2[j] = diag[j] * x[j];
/*<    70    continue >*/
/* L70: */
    }
/*<       dxnorm = enorm(n,wa2) >*/
    dxnorm = enorm_cvkit(n, &wa2[1]);
/*<       fp = dxnorm - delta >*/
    fp = dxnorm - *delta;
/*<       if (fp .le. p1*delta) go to 220 >*/
    if (fp <= p1 * *delta) {
	goto L220;
    }

/*     if the jacobian is not rank deficient, the newton */
/*     step provides a lower bound, parl, for the zero of */
/*     the function. otherwise set this bound to zero. */

/*<       parl = zero >*/
    parl = zero;
/*<       if (nsing .lt. n) go to 120 >*/
    if (nsing < *n) {
	goto L120;
    }
/*<       do 80 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          wa1(j) = diag(l)*(wa2(l)/dxnorm) >*/
	wa1[j] = diag[l] * (wa2[l] / dxnorm);
/*<    80    continue >*/
/* L80: */
    }
/*<       do 110 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          sum = zero >*/
	sum = zero;
/*<          jm1 = j - 1 >*/
	jm1 = j - 1;
/*<          if (jm1 .lt. 1) go to 100 >*/
	if (jm1 < 1) {
	    goto L100;
	}
/*<          do 90 i = 1, jm1 >*/
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             sum = sum + r(i,j)*wa1(i) >*/
	    sum += r__[i__ + j * r_dim1] * wa1[i__];
/*<    90       continue >*/
/* L90: */
	}
/*<   100    continue >*/
L100:
/*<          wa1(j) = (wa1(j) - sum)/r(j,j) >*/
	wa1[j] = (wa1[j] - sum) / r__[j + j * r_dim1];
/*<   110    continue >*/
/* L110: */
    }
/*<       temp = enorm(n,wa1) >*/
    temp = enorm_cvkit(n, &wa1[1]);
/*<       parl = ((fp/delta)/temp)/temp >*/
    parl = fp / *delta / temp / temp;
/*<   120 continue >*/
L120:

/*     calculate an upper bound, paru, for the zero of the function. */

/*<       do 140 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<          sum = zero >*/
	sum = zero;
/*<          do 130 i = 1, j >*/
	i__2 = j;
	for (i__ = 1; i__ <= i__2; ++i__) {
/*<             sum = sum + r(i,j)*qtb(i) >*/
	    sum += r__[i__ + j * r_dim1] * qtb[i__];
/*<   130       continue >*/
/* L130: */
	}
/*<          l = ipvt(j) >*/
	l = ipvt[j];
/*<          wa1(j) = sum/diag(l) >*/
	wa1[j] = sum / diag[l];
/*<   140    continue >*/
/* L140: */
    }
/*<       gnorm = enorm(n,wa1) >*/
    gnorm = enorm_cvkit(n, &wa1[1]);
/*<       paru = gnorm/delta >*/
    paru = gnorm / *delta;
/*<       if (paru .eq. zero) paru = dwarf/dmin1(delta,p1) >*/
    if (paru == zero) {
	paru = dwarf / min(*delta,p1);
    }

/*     if the input par lies outside of the interval (parl,paru), */
/*     set par to the closer endpoint. */

/*<       par = dmax1(par,parl) >*/
    *par = max(*par,parl);
/*<       par = dmin1(par,paru) >*/
    *par = min(*par,paru);
/*<       if (par .eq. zero) par = gnorm/dxnorm >*/
    if (*par == zero) {
	*par = gnorm / dxnorm;
    }

/*     beginning of an iteration. */

/*<   150 continue >*/
L150:
/*<          iter = iter + 1 >*/
    ++iter;

/*        evaluate the function at the current value of par. */

/*<          if (par .eq. zero) par = dmax1(dwarf,p001*paru) >*/
    if (*par == zero) {
/* Computing MAX */
	d__1 = dwarf, d__2 = p001 * paru;
	*par = max(d__1,d__2);
    }
/*<          temp = dsqrt(par) >*/
    temp = sqrt(*par);
/*<          do 160 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa1(j) = temp*diag(j) >*/
	wa1[j] = temp * diag[j];
/*<   160       continue >*/
/* L160: */
    }
/*<          call qrsolv(n,r,ldr,ipvt,wa1,qtb,x,sdiag,wa2) >*/
    qrsolv_cvkit(n, &r__[r_offset], ldr, &ipvt[1], &wa1[1], &qtb[1], &x[1], &sdiag[
	    1], &wa2[1]);
/*<          do 170 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa2(j) = diag(j)*x(j) >*/
	wa2[j] = diag[j] * x[j];
/*<   170       continue >*/
/* L170: */
    }
/*<          dxnorm = enorm(n,wa2) >*/
    dxnorm = enorm_cvkit(n, &wa2[1]);
/*<          temp = fp >*/
    temp = fp;
/*<          fp = dxnorm - delta >*/
    fp = dxnorm - *delta;

/*        if the function is small enough, accept the current value */
/*        of par. also test for the exceptional cases where parl */
/*        is zero or the number of iterations has reached 10. */

/*<    >*/
    if (abs(fp) <= p1 * *delta || (parl == zero && fp <= temp && temp < zero) ||
	     iter == 10) {
	goto L220;
    }

/*        compute the newton correction. */

/*<          do 180 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             l = ipvt(j) >*/
	l = ipvt[j];
/*<             wa1(j) = diag(l)*(wa2(l)/dxnorm) >*/
	wa1[j] = diag[l] * (wa2[l] / dxnorm);
/*<   180       continue >*/
/* L180: */
    }
/*<          do 210 j = 1, n >*/
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/*<             wa1(j) = wa1(j)/sdiag(j) >*/
	wa1[j] /= sdiag[j];
/*<             temp = wa1(j) >*/
	temp = wa1[j];
/*<             jp1 = j + 1 >*/
	jp1 = j + 1;
/*<             if (n .lt. jp1) go to 200 >*/
	if (*n < jp1) {
	    goto L200;
	}
/*<             do 190 i = jp1, n >*/
	i__2 = *n;
	for (i__ = jp1; i__ <= i__2; ++i__) {
/*<                wa1(i) = wa1(i) - r(i,j)*temp >*/
	    wa1[i__] -= r__[i__ + j * r_dim1] * temp;
/*<   190          continue >*/
/* L190: */
	}
/*<   200       continue >*/
L200:
/*<   210       continue >*/
/* L210: */
	;
    }
/*<          temp = enorm(n,wa1) >*/
    temp = enorm_cvkit(n, &wa1[1]);
/*<          parc = ((fp/delta)/temp)/temp >*/
    parc = fp / *delta / temp / temp;

/*        depending on the sign of the function, update parl or paru. */

/*<          if (fp .gt. zero) parl = dmax1(parl,par) >*/
    if (fp > zero) {
	parl = max(parl,*par);
    }
/*<          if (fp .lt. zero) paru = dmin1(paru,par) >*/
    if (fp < zero) {
	paru = min(paru,*par);
    }

/*        compute an improved estimate for par. */

/*<          par = dmax1(parl,par+parc) >*/
/* Computing MAX */
    d__1 = parl, d__2 = *par + parc;
    *par = max(d__1,d__2);

/*        end of an iteration. */

/*<          go to 150 >*/
    goto L150;
/*<   220 continue >*/
L220:

/*     termination. */

/*<       if (iter .eq. 0) par = zero >*/
    if (iter == 0) {
	*par = zero;
    }
/*<       return >*/
    return 0;

/*     last card of subroutine lmpar. */

/*<       end >*/
}